

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-ttl.c
# Opt level: O2

int run_test_udp_multicast_ttl(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  int64_t eval_b_4;
  int64_t eval_b_5;
  int64_t eval_b;
  undefined8 local_168;
  sockaddr_in addr;
  uv_udp_send_t req;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_udp_init(uVar2,&server);
  req.data = (void *)(long)iVar1;
  eval_b = 0;
  if (req.data == (void *)0x0) {
    iVar1 = uv_ip4_addr("0.0.0.0",0,&addr);
    req.data = (void *)(long)iVar1;
    eval_b = 0;
    if (req.data != (void *)0x0) {
      pcVar3 = "uv_ip4_addr(\"0.0.0.0\", 0, &addr)";
      uVar2 = 0x41;
      goto LAB_001a9749;
    }
    iVar1 = uv_udp_bind(&server,&addr,0);
    req.data = (void *)(long)iVar1;
    eval_b = 0;
    if (req.data != (void *)0x0) {
      pcVar3 = "r";
      uVar2 = 0x43;
      goto LAB_001a9749;
    }
    iVar1 = uv_udp_set_multicast_ttl(&server,0x20);
    req.data = (void *)(long)iVar1;
    eval_b = 0;
    if (req.data != (void *)0x0) {
      pcVar3 = "r";
      uVar2 = 0x46;
      goto LAB_001a9749;
    }
    auVar5 = uv_buf_init("PING",4);
    local_168 = auVar5._8_8_;
    eval_b = auVar5._0_8_;
    iVar1 = uv_ip4_addr("239.255.0.1",0x23a3,&addr);
    req.data = (void *)(long)iVar1;
    if (req.data == (void *)0x0) {
      iVar1 = uv_udp_send(&req,&server,&eval_b,1,&addr,sv_send_cb);
      eval_b_4 = (int64_t)iVar1;
      eval_b_5 = 0;
      if ((void *)eval_b_4 == (void *)0x0) {
        eval_b_4 = (int64_t)close_cb_called;
        eval_b_5 = 0;
        if ((void *)eval_b_4 == (void *)0x0) {
          eval_b_4 = (int64_t)sv_send_cb_called;
          eval_b_5 = 0;
          if ((void *)eval_b_4 == (void *)0x0) {
            uVar2 = uv_default_loop();
            uv_run(uVar2,0);
            eval_b_4 = 1;
            eval_b_5 = (int64_t)sv_send_cb_called;
            if (eval_b_5 == 1) {
              eval_b_4 = 1;
              eval_b_5 = (int64_t)close_cb_called;
              if (eval_b_5 == 1) {
                uVar2 = uv_default_loop();
                uv_walk(uVar2,close_walk_cb,0);
                uv_run(uVar2,0);
                eval_b_4 = 0;
                uVar2 = uv_default_loop();
                iVar1 = uv_loop_close(uVar2);
                eval_b_5 = (int64_t)iVar1;
                if (eval_b_5 == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar4 = "uv_loop_close(uv_default_loop())";
                pcVar3 = "0";
                uVar2 = 0x5c;
              }
              else {
                pcVar4 = "close_cb_called";
                pcVar3 = "1";
                uVar2 = 0x5a;
              }
            }
            else {
              pcVar4 = "sv_send_cb_called";
              pcVar3 = "1";
              uVar2 = 0x59;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "sv_send_cb_called";
            uVar2 = 0x54;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "close_cb_called";
          uVar2 = 0x53;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "r";
        uVar2 = 0x51;
      }
      goto LAB_001a98cd;
    }
    pcVar3 = "uv_ip4_addr(\"239.255.0.1\", 9123, &addr)";
    uVar2 = 0x4a;
  }
  else {
    pcVar3 = "r";
    uVar2 = 0x3f;
LAB_001a9749:
    eval_b = 0;
  }
  eval_b_5 = 0;
  pcVar4 = "0";
  eval_b_4 = (int64_t)req.data;
LAB_001a98cd:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-ttl.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_b_4,"==",eval_b_5);
  abort();
}

Assistant:

TEST_IMPL(udp_multicast_ttl) {
  int r;
  uv_udp_send_t req;
  uv_buf_t buf;
  struct sockaddr_in addr;

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  ASSERT_OK(uv_ip4_addr("0.0.0.0", 0, &addr));
  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_set_multicast_ttl(&server, 32);
  ASSERT_OK(r);

  /* server sends "PING" */
  buf = uv_buf_init("PING", 4);
  ASSERT_OK(uv_ip4_addr("239.255.0.1", TEST_PORT, &addr));
  r = uv_udp_send(&req,
                  &server,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  sv_send_cb);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);
  ASSERT_OK(sv_send_cb_called);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, sv_send_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}